

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O1

ktx_error_code_e ktxFileStream_setpos(ktxStream *str,ktx_off_t pos)

{
  ktx_error_code_e kVar1;
  int iVar2;
  ktx_size_t in_RAX;
  ktx_size_t kVar3;
  ktx_size_t fileSize;
  ktx_size_t local_18;
  
  if (str == (ktxStream *)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    if (str->type != eStreamTypeFile) {
      __assert_fail("str->type == eStreamTypeFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                    ,0xff,"ktx_error_code_e ktxFileStream_setpos(ktxStream *, ktx_off_t)");
    }
    if ((str->data).file == _stdin) {
      kVar1 = KTX_FILE_ISPIPE;
      kVar3 = pos - str->readpos;
      if (kVar3 != 0 && str->readpos <= pos) {
        kVar1 = (*str->skip)(str,kVar3);
        return kVar1;
      }
    }
    else {
      local_18 = in_RAX;
      kVar1 = (*str->getsize)(str,&local_18);
      if ((kVar1 == KTX_SUCCESS) && (kVar1 = KTX_INVALID_OPERATION, pos <= (long)local_18)) {
        iVar2 = fseeko((FILE *)(str->data).file,pos,0);
        kVar1 = iVar2 >> 0x1f & KTX_FILE_SEEK_ERROR;
      }
    }
  }
  return kVar1;
}

Assistant:

static
KTX_error_code ktxFileStream_setpos(ktxStream* str, ktx_off_t pos)
{
    ktx_size_t fileSize;
    KTX_error_code result;

    if (!str)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    if (str->data.file == stdin) {
        if (pos > str->readpos)
            return str->skip(str, pos - str->readpos);
        else
            return KTX_FILE_ISPIPE;
    }

    result = str->getsize(str, &fileSize);

    if (result != KTX_SUCCESS) {
        // Device is likely not seekable.
        return result;
    }

    if (pos > (ktx_off_t)fileSize)
        return KTX_INVALID_OPERATION;

    if (fseeko(str->data.file, pos, SEEK_SET) < 0)
            return KTX_FILE_SEEK_ERROR;
    else
            return KTX_SUCCESS;
}